

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O3

EStatusCode __thiscall
CFFPrimitiveReader::ReadCard16(CFFPrimitiveReader *this,unsigned_short *outValue)

{
  undefined1 uVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Byte buffer;
  Byte buffer_1;
  undefined8 uStack_28;
  
  if (this->mInternalState == eFailure) {
    return eFailure;
  }
  uStack_28 = in_RAX;
  iVar2 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])
                    (this->mCFFFile,(long)&uStack_28 + 6,1);
  if (CONCAT44(extraout_var,iVar2) == 1) {
    if (this->mInternalState == eFailure) {
      return eFailure;
    }
    uVar1 = uStack_28._6_1_;
    iVar2 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])
                      (this->mCFFFile,(long)&uStack_28 + 7,1);
    if (CONCAT44(extraout_var_00,iVar2) == 1) {
      *outValue = CONCAT11(uVar1,uStack_28._7_1_);
      return eSuccess;
    }
  }
  this->mInternalState = eFailure;
  return eFailure;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadCard16(unsigned short& outValue)
{
	Byte byte1,byte2;

	if(ReadByte(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadByte(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;


	outValue = ((unsigned short)byte1 << 8) + byte2;

	return PDFHummus::eSuccess;

}